

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O2

reference __thiscall
OpenMesh::BaseKernel::property<int>(BaseKernel *this,FPropHandleT<int> _ph,FaceHandle _fh)

{
  PropertyT<int> *this_00;
  reference pvVar1;
  
  this_00 = PropertyContainer::property<int>
                      (&this->fprops_,_ph.super_BasePropHandleT<int>.super_BaseHandle.idx_);
  pvVar1 = PropertyT<int>::operator[](this_00,(int)_fh.super_BaseHandle.idx_);
  return pvVar1;
}

Assistant:

typename FPropHandleT<T>::reference
  property(FPropHandleT<T> _ph, FaceHandle _fh) {
    return fprops_.property(_ph)[_fh.idx()];
  }